

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O0

lzham_malloc_context lzham::lzham_create_malloc_context(uint arena_size)

{
  malloc_context *p_00;
  uint in_EDI;
  malloc_context *p;
  
  p_00 = (malloc_context *)(*(code *)g_pRealloc)(0,(ulong)in_EDI + 0x47,0,1,g_pUser_data);
  helpers::construct<lzham::malloc_context>(p_00);
  malloc_context::init(p_00,(EVP_PKEY_CTX *)(ulong)in_EDI);
  return p_00;
}

Assistant:

lzham_malloc_context lzham_create_malloc_context(uint arena_size)
   {
      malloc_context *p = static_cast<malloc_context *>((*g_pRealloc)(NULL, (sizeof(malloc_context) - 1) + arena_size + LZHAM_MIN_ALLOC_ALIGNMENT, NULL, true, g_pUser_data));
      helpers::construct(p);
      p->init(arena_size);
      return p;
   }